

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_quaternion.c
# Opt level: O0

char * test_vector3_rotate_by_quaternion_zx_quarter_turn(void)

{
  int iVar1;
  vector3 *pvVar2;
  undefined1 local_2c [8];
  vector3 r;
  quaternion q;
  
  pvVar2 = vector3_get_reference_vector3(1);
  quaternion_set_from_axis_anglev3((quaternion *)((long)&r.field_0 + 4),pvVar2,1.5707964);
  pvVar2 = vector3_get_reference_vector3(3);
  pvVar2 = vector3_set((vector3 *)local_2c,pvVar2);
  vector3_rotate_by_quaternion(pvVar2,(quaternion *)((long)&r.field_0 + 4));
  pvVar2 = vector3_get_reference_vector3(5);
  iVar1 = vector3_equals((vector3 *)local_2c,pvVar2);
  if (iVar1 == 0) {
    q.field_0._8_8_ = anon_var_dwarf_21b;
  }
  else {
    q.field_0._8_8_ = 0;
  }
  return (char *)q.field_0._8_8_;
}

Assistant:

static char *test_vector3_rotate_by_quaternion_zx_quarter_turn(void)
{
	struct quaternion q;
	struct vector3 r;

	quaternion_set_from_axis_anglev3(&q, HYP_VECTOR3_UNIT_X, HYP_TAU / 4.0f);
	vector3_rotate_by_quaternion(vector3_set(&r, HYP_VECTOR3_UNIT_Z), &q);
	test_assert(vector3_equals(&r, HYP_VECTOR3_UNIT_Y_NEGATIVE));

	return NULL;
}